

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

void fmt::v5::internal::format_value<wchar_t,Date>(basic_buffer<wchar_t> *buffer,Date *value)

{
  long lVar1;
  ulong uVar2;
  wostream *pwVar3;
  formatbuf<wchar_t> format_buf;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> output;
  undefined1 auStack_188 [12];
  wchar_t local_17c;
  undefined **local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  locale local_140 [8];
  basic_buffer<wchar_t> *local_138;
  long local_130;
  ios_base local_128 [20];
  undefined4 auStack_114 [61];
  
  local_178 = (undefined **)std::_Rb_tree_increment;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_150 = 0;
  uStack_148 = 0;
  std::locale::locale(local_140);
  local_178 = &PTR__wstreambuf_001b1e28;
  local_138 = buffer;
  std::wostream::wostream(&local_130,(wstreambuf *)&local_178);
  lVar1 = *(long *)(local_130 + -0x18);
  *(undefined4 *)((long)auStack_114 + lVar1) = 5;
  std::wios::clear((int)auStack_188 + (int)lVar1 + 0x58);
  pwVar3 = (wostream *)std::wostream::operator<<(&local_130,value->year_);
  local_17c = L'-';
  pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,&local_17c,1);
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,value->month_);
  local_17c = L'-';
  pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,&local_17c,1);
  std::wostream::operator<<(pwVar3,value->day_);
  uVar2 = buffer->size_;
  if (buffer->capacity_ < uVar2) {
    (**buffer->_vptr_basic_buffer)(buffer,uVar2);
  }
  buffer->size_ = uVar2;
  std::ios_base::~ios_base(local_128);
  local_178 = (undefined **)std::_Rb_tree_increment;
  std::locale::~locale(local_140);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}